

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcCommon.h
# Opt level: O0

void o3dgc::ComputeVectorMinMax
               (Real *tab,unsigned_long size,unsigned_long dim,unsigned_long stride,Real *minTab,
               Real *maxTab,O3DGCSC3DMCQuantizationMode quantMode)

{
  Real RVar1;
  double dVar2;
  ulong local_88;
  unsigned_long d_5;
  unsigned_long d_4;
  Real r_1;
  Real maxr;
  unsigned_long d_3;
  unsigned_long d_2;
  Real r;
  Real diag;
  unsigned_long d_1;
  unsigned_long i;
  unsigned_long d;
  unsigned_long p;
  Real *maxTab_local;
  Real *minTab_local;
  unsigned_long stride_local;
  unsigned_long dim_local;
  unsigned_long size_local;
  Real *tab_local;
  
  if ((size != 0) && (dim != 0)) {
    d = 0;
    for (i = 0; i < dim; i = i + 1) {
      RVar1 = tab[d];
      minTab[i] = RVar1;
      maxTab[i] = RVar1;
      d = d + 1;
    }
    d = stride;
    for (d_1 = 1; d_1 < size; d_1 = d_1 + 1) {
      for (_r = 0; _r < dim; _r = _r + 1) {
        if (maxTab[_r] < tab[d + _r]) {
          maxTab[_r] = tab[d + _r];
        }
        if (tab[d + _r] <= minTab[_r] && minTab[_r] != tab[d + _r]) {
          minTab[_r] = tab[d + _r];
        }
      }
      d = stride + d;
    }
    if (quantMode == O3DGC_SC3DMC_DIAG_BB) {
      d_2._4_4_ = 0.0;
      for (d_3 = 0; d_3 < dim; d_3 = d_3 + 1) {
        d_2._4_4_ = (maxTab[d_3] - minTab[d_3]) * (maxTab[d_3] - minTab[d_3]) + d_2._4_4_;
      }
      dVar2 = std::sqrt((double)(ulong)(uint)d_2._4_4_);
      for (_r_1 = 0; _r_1 < dim; _r_1 = _r_1 + 1) {
        maxTab[_r_1] = minTab[_r_1] + SUB84(dVar2,0);
      }
    }
    else if (quantMode == O3DGC_SC3DMC_MAX_ALL_DIMS) {
      d_4._4_4_ = *maxTab - *minTab;
      for (d_5 = 1; d_5 < dim; d_5 = d_5 + 1) {
        if (d_4._4_4_ < maxTab[d_5] - minTab[d_5]) {
          d_4._4_4_ = maxTab[d_5] - minTab[d_5];
        }
      }
      for (local_88 = 0; local_88 < dim; local_88 = local_88 + 1) {
        maxTab[local_88] = minTab[local_88] + d_4._4_4_;
      }
    }
  }
  return;
}

Assistant:

inline void ComputeVectorMinMax(const Real * const tab, 
                                    unsigned long size, 
                                    unsigned long dim,
                                    unsigned long stride,
                                    Real * minTab,
                                    Real * maxTab,
                                    O3DGCSC3DMCQuantizationMode quantMode)
    {
        if (size == 0 || dim == 0)
        {
            return;
        }
        unsigned long p = 0;
        for(unsigned long d = 0; d < dim; ++d)
        {
            maxTab[d] = minTab[d] = tab[p++];
        }
        p = stride;
        for(unsigned long i = 1; i < size; ++i)
        {
            for(unsigned long d = 0; d < dim; ++d)
            {
                if (maxTab[d] < tab[p+d]) maxTab[d] = tab[p+d];
                if (minTab[d] > tab[p+d]) minTab[d] = tab[p+d];
            }
            p += stride;
        }

        if (quantMode == O3DGC_SC3DMC_DIAG_BB)
        {
            Real diag = Real( 0.0 );
            Real r;
            for(unsigned long d = 0; d < dim; ++d)
            {
                r     = (maxTab[d] - minTab[d]);
                diag += r*r;
            } 
            diag = static_cast<Real>(sqrt(diag));
            for(unsigned long d = 0; d < dim; ++d)
            {
                 maxTab[d] = minTab[d] + diag;
            } 
        }
        else if (quantMode == O3DGC_SC3DMC_MAX_ALL_DIMS)
        {            
            Real maxr = (maxTab[0] - minTab[0]);
            Real r;
            for(unsigned long d = 1; d < dim; ++d)
            {
                r = (maxTab[d] - minTab[d]);
                if ( r > maxr)
                {
                    maxr = r;
                }
            } 
            for(unsigned long d = 0; d < dim; ++d)
            {
                 maxTab[d] = minTab[d] + maxr;
            } 
        }
    }